

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O0

int xmlNanoFTPGetSocket(void *ctx,char *filename)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int len;
  int res;
  char buf [300];
  xmlNanoFTPCtxtPtr ctxt;
  char *filename_local;
  void *ctx_local;
  
  if (ctx == (void *)0x0) {
    ctx_local._4_4_ = -1;
  }
  else if ((filename == (char *)0x0) && (*(long *)((long)ctx + 0x18) == 0)) {
    ctx_local._4_4_ = -1;
  }
  else {
    unique0x100001dc = ctx;
    iVar1 = xmlNanoFTPGetConnection(ctx);
    *(int *)((long)stack0xffffffffffffffd8 + 0x48) = iVar1;
    if (*(int *)((long)stack0xffffffffffffffd8 + 0x48) == -1) {
      ctx_local._4_4_ = -1;
    }
    else {
      snprintf((char *)&len,300,"TYPE I\r\n");
      sVar2 = strlen((char *)&len);
      sVar3 = send(*(int *)((long)stack0xffffffffffffffd8 + 0x44),&len,(long)(int)sVar2,0);
      if ((int)sVar3 < 0) {
        __xmlIOErr(9,0,"send failed");
        close(*(int *)((long)stack0xffffffffffffffd8 + 0x48));
        *(undefined4 *)((long)stack0xffffffffffffffd8 + 0x48) = 0xffffffff;
        ctx_local._4_4_ = -1;
      }
      else {
        iVar1 = xmlNanoFTPReadResponse(stack0xffffffffffffffd8);
        if (iVar1 == 2) {
          if (filename == (char *)0x0) {
            snprintf((char *)&len,300,"RETR %s\r\n");
          }
          else {
            snprintf((char *)&len,300,"RETR %s\r\n");
          }
          buf[0x123] = '\0';
          sVar2 = strlen((char *)&len);
          sVar3 = send(*(int *)((long)stack0xffffffffffffffd8 + 0x44),&len,(long)(int)sVar2,0);
          if ((int)sVar3 < 0) {
            __xmlIOErr(9,0,"send failed");
            close(*(int *)((long)stack0xffffffffffffffd8 + 0x48));
            *(undefined4 *)((long)stack0xffffffffffffffd8 + 0x48) = 0xffffffff;
            ctx_local._4_4_ = -1;
          }
          else {
            iVar1 = xmlNanoFTPReadResponse(stack0xffffffffffffffd8);
            if (iVar1 == 1) {
              ctx_local._4_4_ = *(int *)((long)stack0xffffffffffffffd8 + 0x48);
            }
            else {
              close(*(int *)((long)stack0xffffffffffffffd8 + 0x48));
              *(undefined4 *)((long)stack0xffffffffffffffd8 + 0x48) = 0xffffffff;
              ctx_local._4_4_ = -1;
            }
          }
        }
        else {
          close(*(int *)((long)stack0xffffffffffffffd8 + 0x48));
          *(undefined4 *)((long)stack0xffffffffffffffd8 + 0x48) = 0xffffffff;
          ctx_local._4_4_ = -1;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

SOCKET
xmlNanoFTPGetSocket(void *ctx, const char *filename) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    char buf[300];
    int res, len;
    if (ctx == NULL)
	return INVALID_SOCKET;
    if ((filename == NULL) && (ctxt->path == NULL))
	return INVALID_SOCKET;
    ctxt->dataFd = xmlNanoFTPGetConnection(ctxt);
    if (ctxt->dataFd == INVALID_SOCKET)
	return INVALID_SOCKET;

    snprintf(buf, sizeof(buf), "TYPE I\r\n");
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf);
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	closesocket(ctxt->dataFd); ctxt->dataFd = INVALID_SOCKET;
	return INVALID_SOCKET;
    }
    res = xmlNanoFTPReadResponse(ctxt);
    if (res != 2) {
	closesocket(ctxt->dataFd); ctxt->dataFd = INVALID_SOCKET;
	return INVALID_SOCKET;
    }
    if (filename == NULL)
	snprintf(buf, sizeof(buf), "RETR %s\r\n", ctxt->path);
    else
	snprintf(buf, sizeof(buf), "RETR %s\r\n", filename);
    buf[sizeof(buf) - 1] = 0;
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf);
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	closesocket(ctxt->dataFd); ctxt->dataFd = INVALID_SOCKET;
	return INVALID_SOCKET;
    }
    res = xmlNanoFTPReadResponse(ctxt);
    if (res != 1) {
	closesocket(ctxt->dataFd); ctxt->dataFd = INVALID_SOCKET;
	return INVALID_SOCKET;
    }
    return(ctxt->dataFd);
}